

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fillInCell(MemPage *pPage,uchar *pCell,BtreePayload *pX,int *pnSize)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Pgno key;
  Pgno PVar7;
  Pgno *in_RCX;
  MemPage **in_RDX;
  BtShared *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  u8 eType;
  Pgno pgnoPtrmap;
  int nHeader;
  BtShared *pBt;
  uchar *pPayload;
  uchar *pPrior;
  MemPage *pToRelease;
  int spaceLeft;
  int mn;
  int n;
  int nSrc;
  u8 *pSrc;
  int nPayload;
  MemPage *pOvfl;
  Pgno pgnoOvfl;
  int rc;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff6c;
  uint local_90;
  Pgno in_stack_ffffffffffffff74;
  Pgno PVar9;
  BtShared *pBt_00;
  uchar *local_78;
  uchar *local_70;
  uint local_60;
  Pgno local_58;
  uint local_54;
  MemPage *local_50;
  u8 in_stack_ffffffffffffffbb;
  int local_1c;
  Pgno local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)*(byte *)(in_RDI + 10);
  if (*(char *)(in_RDI + 1) == '\0') {
    local_54 = (uint)in_RDX[1];
    local_50 = *in_RDX;
    uVar4 = local_54;
    if (local_54 < 0x80) {
      *(char *)((long)&in_RSI->pPager + (long)(int)uVar3) = (char)in_RDX[1];
      in_stack_ffffffffffffff6c = 1;
    }
    else {
      in_stack_ffffffffffffff6c =
           sqlite3PutVarint((uchar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            0x192104);
    }
    key = (in_stack_ffffffffffffff6c & 0xff) + uVar3;
  }
  else {
    uVar4 = *(int *)((long)in_RDX + 0x24) + *(int *)(in_RDX + 5);
    local_50 = in_RDX[2];
    local_54 = *(uint *)((long)in_RDX + 0x24);
    if (uVar4 < 0x80) {
      *(char *)((long)&in_RSI->pPager + (long)(int)uVar3) = (char)uVar4;
      local_90 = 1;
    }
    else {
      local_90 = sqlite3PutVarint((uchar *)CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58),0x19206f);
    }
    iVar5 = (local_90 & 0xff) + uVar3;
    iVar6 = sqlite3PutVarint((uchar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             0x19209d);
    key = iVar6 + iVar5;
  }
  local_78 = (uchar *)((long)&in_RSI->pPager + (long)(int)key);
  if ((int)(uint)*(ushort *)(in_RDI + 0xe) < (int)uVar4) {
    uVar3 = (uint)*(ushort *)(in_RDI + 0x10);
    local_58 = uVar3 + (uVar4 - uVar3) % (*(int *)(*(long *)(in_RDI + 0x48) + 0x38) - 4U);
    if ((int)(uint)*(ushort *)(in_RDI + 0xe) < (int)local_58) {
      local_58 = uVar3;
    }
    local_60 = local_58;
    *in_RCX = local_58 + key + 4;
    local_70 = (uchar *)((long)&in_RSI->pPager + (long)(int)(key + local_58));
    local_10 = 0;
    pBt_00 = *(BtShared **)(in_RDI + 0x48);
    while( true ) {
      local_58 = uVar4;
      if ((int)local_60 < (int)uVar4) {
        local_58 = local_60;
      }
      if ((int)local_54 < (int)local_58) {
        if ((int)local_54 < 1) {
          memset(local_78,0,(long)(int)local_58);
        }
        else {
          local_58 = local_54;
          memcpy(local_78,local_50,(long)(int)local_54);
        }
      }
      else {
        memcpy(local_78,local_50,(long)(int)local_58);
      }
      uVar4 = uVar4 - local_58;
      if ((int)uVar4 < 1) break;
      local_78 = local_78 + (int)local_58;
      local_50 = (MemPage *)((long)local_50->aiOvfl + (long)(int)local_58 + -0x1c);
      local_54 = local_54 - local_58;
      local_60 = local_60 - local_58;
      if (local_60 == 0) {
        PVar9 = local_10;
        if (pBt_00->autoVacuum != '\0') {
          do {
            local_10 = local_10 + 1;
            PVar7 = ptrmapPageno(pBt_00,local_10);
            bVar8 = true;
            if (PVar7 != local_10) {
              bVar8 = local_10 == (uint)sqlite3PendingByte / pBt_00->pageSize + 1;
            }
          } while (bVar8);
        }
        local_1c = allocateBtreePage(in_RSI,in_RDX,in_RCX,uVar4,in_stack_ffffffffffffffbb);
        if ((pBt_00->autoVacuum != '\0') && (local_1c == 0)) {
          uVar2 = 3;
          if (PVar9 != 0) {
            uVar2 = 4;
          }
          in_stack_ffffffffffffff74 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff74);
          ptrmapPut(pBt_00,key,(u8)(PVar9 >> 0x18),in_stack_ffffffffffffff74,
                    (int *)CONCAT44(in_stack_ffffffffffffff6c,uVar3));
        }
        if (local_1c != 0) {
          releasePage((MemPage *)0x19247c);
          goto LAB_00192512;
        }
        sqlite3Put4byte(local_70,local_10);
        releasePage((MemPage *)0x1924aa);
        local_70 = puRam0000000000000050;
        sqlite3Put4byte(puRam0000000000000050,0);
        local_78 = puRam0000000000000050 + 4;
        local_60 = pBt_00->usableSize - 4;
      }
    }
    releasePage((MemPage *)0x192507);
    local_1c = 0;
  }
  else {
    local_58 = key + uVar4;
    if ((int)local_58 < 4) {
      local_58 = 4;
      local_78[(int)uVar4] = '\0';
    }
    *in_RCX = local_58;
    memcpy(local_78,local_50,(long)(int)local_54);
    memset(local_78 + (int)local_54,0,(long)(int)(uVar4 - local_54));
    local_1c = 0;
  }
LAB_00192512:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

static int fillInCell(
  MemPage *pPage,                /* The page that contains the cell */
  unsigned char *pCell,          /* Complete text of the cell */
  const BtreePayload *pX,        /* Payload with which to construct the cell */
  int *pnSize                    /* Write cell size here */
){
  int nPayload;
  const u8 *pSrc;
  int nSrc, n, rc, mn;
  int spaceLeft;
  MemPage *pToRelease;
  unsigned char *pPrior;
  unsigned char *pPayload;
  BtShared *pBt;
  Pgno pgnoOvfl;
  int nHeader;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );

  /* pPage is not necessarily writeable since pCell might be auxiliary
  ** buffer space that is separate from the pPage buffer area */
  assert( pCell<pPage->aData || pCell>=&pPage->aData[pPage->pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

  /* Fill in the header. */
  nHeader = pPage->childPtrSize;
  if( pPage->intKey ){
    nPayload = pX->nData + pX->nZero;
    pSrc = pX->pData;
    nSrc = pX->nData;
    assert( pPage->intKeyLeaf ); /* fillInCell() only called for leaves */
    nHeader += putVarint32(&pCell[nHeader], nPayload);
    nHeader += putVarint(&pCell[nHeader], *(u64*)&pX->nKey);
  }else{
    assert( pX->nKey<=0x7fffffff && pX->pKey!=0 );
    nSrc = nPayload = (int)pX->nKey;
    pSrc = pX->pKey;
    nHeader += putVarint32(&pCell[nHeader], nPayload);
  }

  /* Fill in the payload */
  pPayload = &pCell[nHeader];
  if( nPayload<=pPage->maxLocal ){
    /* This is the common case where everything fits on the btree page
    ** and no overflow pages are required. */
    n = nHeader + nPayload;
    testcase( n==3 );
    testcase( n==4 );
    if( n<4 ){
      n = 4;
      pPayload[nPayload] = 0;
    }
    *pnSize = n;
    assert( nSrc<=nPayload );
    testcase( nSrc<nPayload );
    memcpy(pPayload, pSrc, nSrc);
    memset(pPayload+nSrc, 0, nPayload-nSrc);
    return SQLITE_OK;
  }

  /* If we reach this point, it means that some of the content will need
  ** to spill onto overflow pages.
  */
  mn = pPage->minLocal;
  n = mn + (nPayload - mn) % (pPage->pBt->usableSize - 4);
  testcase( n==pPage->maxLocal );
  testcase( n==pPage->maxLocal+1 );
  if( n > pPage->maxLocal ) n = mn;
  spaceLeft = n;
  *pnSize = n + nHeader + 4;
  pPrior = &pCell[nHeader+n];
  pToRelease = 0;
  pgnoOvfl = 0;
  pBt = pPage->pBt;

  /* At this point variables should be set as follows:
  **
  **   nPayload           Total payload size in bytes
  **   pPayload           Begin writing payload here
  **   spaceLeft          Space available at pPayload.  If nPayload>spaceLeft,
  **                      that means content must spill into overflow pages.
  **   *pnSize            Size of the local cell (not counting overflow pages)
  **   pPrior             Where to write the pgno of the first overflow page
  **
  ** Use a call to btreeParseCellPtr() to verify that the values above
  ** were computed correctly.
  */
#ifdef SQLITE_DEBUG
  {
    CellInfo info;
    pPage->xParseCell(pPage, pCell, &info);
    assert( nHeader==(int)(info.pPayload - pCell) );
    assert( info.nKey==pX->nKey );
    assert( *pnSize == info.nSize );
    assert( spaceLeft == info.nLocal );
  }
#endif

  /* Write the payload into the local Cell and any extra into overflow pages */
  while( 1 ){
    n = nPayload;
    if( n>spaceLeft ) n = spaceLeft;

    /* If pToRelease is not zero than pPayload points into the data area
    ** of pToRelease.  Make sure pToRelease is still writeable. */
    assert( pToRelease==0 || sqlite3PagerIswriteable(pToRelease->pDbPage) );

    /* If pPayload is part of the data area of pPage, then make sure pPage
    ** is still writeable */
    assert( pPayload<pPage->aData || pPayload>=&pPage->aData[pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

    if( nSrc>=n ){
      memcpy(pPayload, pSrc, n);
    }else if( nSrc>0 ){
      n = nSrc;
      memcpy(pPayload, pSrc, n);
    }else{
      memset(pPayload, 0, n);
    }
    nPayload -= n;
    if( nPayload<=0 ) break;
    pPayload += n;
    pSrc += n;
    nSrc -= n;
    spaceLeft -= n;
    if( spaceLeft==0 ){
      MemPage *pOvfl = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      Pgno pgnoPtrmap = pgnoOvfl; /* Overflow page pointer-map entry page */
      if( pBt->autoVacuum ){
        do{
          pgnoOvfl++;
        } while(
          PTRMAP_ISPAGE(pBt, pgnoOvfl) || pgnoOvfl==PENDING_BYTE_PAGE(pBt)
        );
      }
#endif
      rc = allocateBtreePage(pBt, &pOvfl, &pgnoOvfl, pgnoOvfl, 0);
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the database supports auto-vacuum, and the second or subsequent
      ** overflow page is being allocated, add an entry to the pointer-map
      ** for that page now.
      **
      ** If this is the first overflow page, then write a partial entry
      ** to the pointer-map. If we write nothing to this pointer-map slot,
      ** then the optimistic overflow chain processing in clearCell()
      ** may misinterpret the uninitialized values and delete the
      ** wrong pages from the database.
      */
      if( pBt->autoVacuum && rc==SQLITE_OK ){
        u8 eType = (pgnoPtrmap?PTRMAP_OVERFLOW2:PTRMAP_OVERFLOW1);
        ptrmapPut(pBt, pgnoOvfl, eType, pgnoPtrmap, &rc);
        if( rc ){
          releasePage(pOvfl);
        }
      }
#endif
      if( rc ){
        releasePage(pToRelease);
        return rc;
      }

      /* If pToRelease is not zero than pPrior points into the data area
      ** of pToRelease.  Make sure pToRelease is still writeable. */
      assert( pToRelease==0 || sqlite3PagerIswriteable(pToRelease->pDbPage) );

      /* If pPrior is part of the data area of pPage, then make sure pPage
      ** is still writeable */
      assert( pPrior<pPage->aData || pPrior>=&pPage->aData[pBt->pageSize]
            || sqlite3PagerIswriteable(pPage->pDbPage) );

      put4byte(pPrior, pgnoOvfl);
      releasePage(pToRelease);
      pToRelease = pOvfl;
      pPrior = pOvfl->aData;
      put4byte(pPrior, 0);
      pPayload = &pOvfl->aData[4];
      spaceLeft = pBt->usableSize - 4;
    }
  }
  releasePage(pToRelease);
  return SQLITE_OK;
}